

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  cmInstallScriptGenerator *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *path;
  bool bVar1;
  TargetType TVar2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_01;
  reference ppcVar3;
  char *pcVar4;
  ulong uVar5;
  string *psVar6;
  undefined1 local_4f0 [8];
  cmInstallScriptGenerator g_3;
  string local_3f8;
  char *local_3d8;
  char *postinstall;
  cmInstallTargetGeneratorLocal g_2;
  cmInstallTargetGeneratorLocal g_1;
  string destination;
  cmInstallScriptGenerator g;
  allocator<char> local_79;
  string local_78;
  char *local_58;
  char *preinstall;
  cmGeneratorTarget *l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *tgts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurationTypes_local;
  string *config_local;
  ostream *os_local;
  cmLocalGenerator *this_local;
  
  this_01 = GetGeneratorTargets(this);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_01);
  l = (cmGeneratorTarget *)
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                *)&l);
    if (!bVar1) {
      return;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    preinstall = (char *)*ppcVar3;
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)preinstall);
    pcVar4 = preinstall;
    if (TVar2 != INTERFACE_LIBRARY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"PRE_INSTALL_SCRIPT",&local_79);
      pcVar4 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar4,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      local_58 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        this_00 = (cmInstallScriptGenerator *)((long)&destination.field_2 + 8);
        cmInstallScriptGenerator::cmInstallScriptGenerator(this_00,pcVar4,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)this_00,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)((long)&destination.field_2 + 8));
      }
      cmTarget::GetInstallPath_abi_cxx11_(*(cmTarget **)preinstall);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        psVar6 = cmTarget::GetInstallPath_abi_cxx11_(*(cmTarget **)preinstall);
        path = &g_1.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        std::__cxx11::string::substr((ulong)path,(ulong)psVar6);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)path);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=
                    ((string *)
                     &g_1.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,".");
        }
        TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)preinstall);
        if (TVar2 < SHARED_LIBRARY) {
LAB_0049f033:
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)preinstall);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,this,psVar6,pcVar4,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)
                     &g_2.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,os,config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else if (TVar2 == SHARED_LIBRARY) {
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)preinstall);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall,this,psVar6,pcVar4,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)&postinstall,os,config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall);
        }
        else if (TVar2 == MODULE_LIBRARY) goto LAB_0049f033;
        std::__cxx11::string::~string
                  ((string *)
                   &g_1.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      pcVar4 = preinstall;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"POST_INSTALL_SCRIPT",(allocator<char> *)&g_3.field_0xef);
      pcVar4 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar4,&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&g_3.field_0xef);
      local_3d8 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_4f0,pcVar4,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_4f0,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_4f0);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const std::vector<cmGeneratorTarget*>& tgts = this->GetGeneratorTargets();
  for (cmGeneratorTarget* l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (const char* preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(preinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(),
                                           destination.c_str(), true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(),
                                           destination.c_str(), false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (const char* postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(postinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}